

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O3

int stMain(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  err_t code;
  char *pcVar3;
  u32 tests;
  octet crc [32];
  octet aoStack_88 [32];
  char local_68 [80];
  
  if (argc < 2) {
    printf("bee2cmd/%s: %s\nUsage:\n  st alg\n    test cryptographic algorithms\n  st rng\n    test random number generator\n  st stamp\n    validate attached stamp\n  st crc\n    print checksum\n  st crc <prefix>\n    print checksum calculated using <prefix>\n"
           ,"st","self-testing");
    return -1;
  }
  iVar1 = strCmp(argv[1],"alg");
  if (iVar1 == 0) {
    if (argc != 2) {
      code = 0x25b;
LAB_0010c969:
      iVar1 = -1;
      goto LAB_0010c9c6;
    }
    tests = 0x1f;
LAB_0010c8ea:
    code = cmdStDo(tests);
  }
  else {
    iVar1 = strCmp(argv[1],"rng");
    if (iVar1 == 0) {
      code = 0x25b;
      iVar1 = -1;
      if (argc != 2) goto LAB_0010c9c6;
      code = cmdStDo(0x10);
      if (code != 0) goto LAB_0010c98e;
      code = cmdRngStart(1);
    }
    else {
      iVar1 = strCmp(argv[1],"stamp");
      if (iVar1 == 0) {
        code = 0x25b;
        iVar1 = -1;
        if (argc != 2) goto LAB_0010c9c6;
        code = cmdStDo(1);
        if (code == 0) {
          tests = 0x2000000;
          goto LAB_0010c8ea;
        }
LAB_0010c98e:
        iVar1 = -1;
        goto LAB_0010c9c6;
      }
      iVar1 = strCmp(argv[1],"crc");
      if (iVar1 != 0) {
        code = 0x259;
        goto LAB_0010c969;
      }
      code = 0x25b;
      if ((argc - 2U < 2) && (code = cmdStDo(4), code == 0)) {
        if (argc == 2) {
          pcVar3 = (char *)0x0;
        }
        else {
          pcVar3 = argv[2];
        }
        code = cmdStCrc(aoStack_88,pcVar3);
        if (code == 0) {
          hexFrom(local_68,aoStack_88,0x20);
          hexLower(local_68);
          iVar1 = printf("%s\n",local_68);
          code = iVar1 >> 0x1f & 0x65;
        }
      }
    }
  }
  iVar1 = -1;
  if (code == 0) {
    iVar1 = strCmp(argv[1],"alg");
    if (iVar1 == 0) {
      iVar1 = 0;
      code = 0;
    }
    else {
      iVar2 = strCmp(argv[1],"stamp");
      iVar1 = 0;
      code = 0;
      if (iVar2 != 0) {
        return 0;
      }
    }
  }
LAB_0010c9c6:
  pcVar3 = errMsg(code);
  printf("bee2cmd/%s: %s\n","st",pcVar3);
  return iVar1;
}

Assistant:

int stMain(int argc, char* argv[])
{
	err_t code;
	// справка
	if (argc < 2)
		return stUsage();
	// разбор команды
	++argv, --argc;
	if (strEq(argv[0], "alg"))
		code = stAlg(argc - 1, argv + 1);
	else if (strEq(argv[0], "rng"))
		code = stRng(argc - 1, argv + 1);
	else if (strEq(argv[0], "stamp"))
		code = stStamp(argc - 1, argv + 1);
	else if (strEq(argv[0], "crc"))
		code = stCrc(argc - 1, argv + 1);
	else
		code = ERR_CMD_NOT_FOUND;
	// завершить
	if (code != ERR_OK || strEq(argv[0], "alg") || strEq(argv[0], "stamp"))
		printf("bee2cmd/%s: %s\n", _name, errMsg(code));
	return code != ERR_OK ? -1 : 0;
}